

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_serializer.cpp
# Opt level: O3

void __thiscall Serializer_Normal_Test::TestBody(Serializer_Normal_Test *this)

{
  long *plVar1;
  bool bVar2;
  char *pcVar3;
  Serializer obj;
  Serializer obj2;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  Serializer builder;
  undefined1 local_110 [40];
  Serializer local_e8;
  string local_c0;
  string local_a0;
  internal local_80 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  ByteData local_70;
  ByteData local_58;
  Serializer local_40;
  
  cfd::core::Serializer::Serializer(&local_40);
  cfd::core::Serializer::AddDirectNumber(&local_40,1);
  cfd::core::Serializer::AddDirectNumber(&local_40,2);
  cfd::core::Serializer::AddDirectByte(&local_40,'\x03');
  cfd::core::Serializer::AddVariableInt(&local_40,0x1ffff);
  plVar1 = (long *)(local_110 + 0x10);
  local_110._0_8_ = plVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"f1f2","");
  cfd::core::ByteData::ByteData((ByteData *)&local_e8,(string *)local_110);
  cfd::core::Serializer::AddVariableBuffer(&local_40,(ByteData *)&local_e8);
  if (local_e8._vptr_Serializer != (_func_int **)0x0) {
    operator_delete(local_e8._vptr_Serializer,
                    (long)local_e8.buffer_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)local_e8._vptr_Serializer);
  }
  if ((long *)local_110._0_8_ != plVar1) {
    operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
  }
  local_110._0_8_ = plVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"d1d2d3d4","");
  cfd::core::ByteData::ByteData((ByteData *)&local_e8,(string *)local_110);
  cfd::core::Serializer::AddPrefixBuffer(&local_40,0xe1e2e3e4,(ByteData *)&local_e8);
  if (local_e8._vptr_Serializer != (_func_int **)0x0) {
    operator_delete(local_e8._vptr_Serializer,
                    (long)local_e8.buffer_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)local_e8._vptr_Serializer);
  }
  if ((long *)local_110._0_8_ != plVar1) {
    operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
  }
  local_110._0_8_ = plVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"c1c2c3c4","");
  cfd::core::ByteData::ByteData((ByteData *)&local_e8,(string *)local_110);
  cfd::core::Serializer::AddDirectBytes(&local_40,(ByteData *)&local_e8);
  if (local_e8._vptr_Serializer != (_func_int **)0x0) {
    operator_delete(local_e8._vptr_Serializer,
                    (long)local_e8.buffer_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)local_e8._vptr_Serializer);
  }
  if ((long *)local_110._0_8_ != plVar1) {
    operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
  }
  cfd::core::Serializer::Output((ByteData *)&local_e8,&local_40);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_110,(ByteData *)&local_e8);
  testing::internal::CmpHelperEQ<char[71],std::__cxx11::string>
            ((internal *)&local_c0,
             "\"01000000020000000000000003feffff010002f1f209fee4e3e2e1d1d2d3d4c1c2c3c4\"",
             "builder.Output().GetHex()",
             (char (*) [71])"01000000020000000000000003feffff010002f1f209fee4e3e2e1d1d2d3d4c1c2c3c4"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110);
  if ((long *)local_110._0_8_ != plVar1) {
    operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
  }
  if (local_e8._vptr_Serializer != (_func_int **)0x0) {
    operator_delete(local_e8._vptr_Serializer,
                    (long)local_e8.buffer_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)local_e8._vptr_Serializer);
  }
  if ((char)local_c0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_110);
    if ((undefined8 *)local_c0._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_c0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_serializer.cpp"
               ,0x18,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
    if ((long *)local_110._0_8_ != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_110._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_110._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_c0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Serializer::Serializer((Serializer *)local_110,&local_40);
  cfd::core::Serializer::Serializer(&local_e8);
  cfd::core::Serializer::operator=(&local_e8,&local_40);
  cfd::core::Serializer::Output(&local_58,&local_40);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_c0,&local_58);
  cfd::core::Serializer::Output(&local_70,(Serializer *)local_110);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_a0,&local_70);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_80,"builder.Output().GetHex()","obj.Output().GetHex()",&local_c0,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (local_70.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_c0._M_dataplus._M_p._1_7_,(char)local_c0._M_dataplus._M_p) !=
      &local_c0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_c0._M_dataplus._M_p._1_7_,(char)local_c0._M_dataplus._M_p),
                    local_c0.field_2._M_allocated_capacity + 1);
  }
  if (local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c0);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_serializer.cpp"
               ,0x1d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
    if (CONCAT71(local_c0._M_dataplus._M_p._1_7_,(char)local_c0._M_dataplus._M_p) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT71(local_c0._M_dataplus._M_p._1_7_,(char)local_c0._M_dataplus._M_p) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_c0._M_dataplus._M_p._1_7_,
                                       (char)local_c0._M_dataplus._M_p) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Serializer::Output(&local_58,&local_40);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_c0,&local_58);
  cfd::core::Serializer::Output(&local_70,&local_e8);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_a0,&local_70);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_80,"builder.Output().GetHex()","obj2.Output().GetHex()",&local_c0,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (local_70.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_c0._M_dataplus._M_p._1_7_,(char)local_c0._M_dataplus._M_p) !=
      &local_c0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_c0._M_dataplus._M_p._1_7_,(char)local_c0._M_dataplus._M_p),
                    local_c0.field_2._M_allocated_capacity + 1);
  }
  if (local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c0);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_serializer.cpp"
               ,0x1e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
    if (CONCAT71(local_c0._M_dataplus._M_p._1_7_,(char)local_c0._M_dataplus._M_p) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT71(local_c0._M_dataplus._M_p._1_7_,(char)local_c0._M_dataplus._M_p) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_c0._M_dataplus._M_p._1_7_,
                                       (char)local_c0._M_dataplus._M_p) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_e8._vptr_Serializer = (_func_int **)&PTR__Serializer_007d5de8;
  if (local_e8.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.buffer_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.buffer_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.buffer_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_110._0_8_ = &PTR__Serializer_007d5de8;
  if ((pointer)local_110._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_110._8_8_,local_110._24_8_ - local_110._8_8_);
  }
  local_40._vptr_Serializer = (_func_int **)&PTR__Serializer_007d5de8;
  if (local_40.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.buffer_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.buffer_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.buffer_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(Serializer, Normal) {
  Serializer builder;
  builder.AddDirectNumber(uint32_t{1});
  builder.AddDirectNumber(uint64_t{2});
  builder.AddDirectByte(3);
  builder.AddVariableInt(0x01ffff);
  builder.AddVariableBuffer(ByteData("f1f2"));
  builder.AddPrefixBuffer(0xe1e2e3e4, ByteData("d1d2d3d4"));
  builder.AddDirectBytes(ByteData("c1c2c3c4"));

  EXPECT_EQ("01000000020000000000000003feffff010002f1f209fee4e3e2e1d1d2d3d4c1c2c3c4",
      builder.Output().GetHex());

  Serializer obj(builder);
  Serializer obj2;
  obj2 = builder;
  EXPECT_EQ(builder.Output().GetHex(), obj.Output().GetHex());
  EXPECT_EQ(builder.Output().GetHex(), obj2.Output().GetHex());
}